

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::GetSpike
          (NESTcalc *this,int Nph,double dx,double dy,double dz,double driftSpeed,double dS_mid,
          vector<double,_std::allocator<double>_> *oldScint)

{
  value_type vVar1;
  VDetector *pVVar2;
  const_reference pvVar3;
  reference pvVar4;
  RandomGen *this_00;
  vector<double,_std::allocator<double>_> *pvVar5;
  double dVar6;
  double __x;
  double dVar7;
  double dVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int local_64;
  double *local_60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<double,_std::allocator<double>_> *oldScint_local;
  double dS_mid_local;
  double driftSpeed_local;
  double dz_local;
  double dy_local;
  double dx_local;
  NESTcalc *pNStack_18;
  int Nph_local;
  NESTcalc *this_local;
  
  local_50 = oldScint;
  oldScint_local = (vector<double,_std::allocator<double>_> *)dS_mid;
  dS_mid_local = driftSpeed;
  driftSpeed_local = dz;
  dz_local = dy;
  dy_local = dx;
  dx_local._4_4_ = Nph;
  pNStack_18 = this;
  local_58._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(&this->newSpike);
  local_60 = (double *)std::vector<double,_std::allocator<double>_>::end(&this->newSpike);
  local_64 = 0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (local_58,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      local_60,&local_64);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_50,7);
  if (*pvVar3 <= 120.0) {
    this_00 = RandomGen::rndm();
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_50,6);
    dVar8 = *pvVar3;
    dVar6 = VDetector::get_sPEres(this->fdetector);
    pvVar5 = local_50;
    std::vector<double,_std::allocator<double>_>::operator[](local_50,6);
    std::abs((int)pvVar5);
    dVar7 = sqrt(__x);
    dVar8 = RandomGen::rand_zero_trunc_gauss(this_00,dVar8,(dVar6 / 4.0) * dVar7);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->newSpike,0);
    *pvVar4 = dVar8;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->newSpike,0);
    dVar8 = *pvVar4;
    (*this->fdetector->_vptr_VDetector[3])(dy_local,dz_local,driftSpeed_local,this->fdetector,1);
    pVVar2 = this->fdetector;
    dVar6 = VDetector::get_TopDrift(this->fdetector);
    pvVar5 = oldScint_local;
    dVar7 = VDetector::get_dtCntr(this->fdetector);
    (*pVVar2->_vptr_VDetector[3])(0,0,-(double)pvVar5 * dVar7 + dVar6,pVVar2,1);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->newSpike,1);
    *pvVar4 = (dVar8 / extraout_XMM0_Qa) * extraout_XMM0_Qa_00;
  }
  else {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_50,4);
    vVar1 = *pvVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->newSpike,0);
    *pvVar4 = vVar1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_50,5);
    vVar1 = *pvVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->newSpike,1);
    *pvVar4 = vVar1;
  }
  this_local = (NESTcalc *)&this->newSpike;
  return (vector<double,_std::allocator<double>_> *)this_local;
}

Assistant:

const vector<double> &NESTcalc::GetSpike(int Nph, double dx, double dy,
                                         double dz, double driftSpeed,
                                         double dS_mid,
                                         const vector<double> &oldScint) {
  std::fill(newSpike.begin(), newSpike.end(), 0);

  if (oldScint[7] > SPIKES_MAXM) {
    newSpike[0] = oldScint[4];
    newSpike[1] = oldScint[5];
    return newSpike;
  }
  newSpike[0] = RandomGen::rndm()->rand_zero_trunc_gauss(
      oldScint[6],
      (fdetector->get_sPEres() / 4.) * sqrt(std::abs(oldScint[6])));
  if (XYcorr == 0 || XYcorr == 2) {
    dx = 0.;
    dy = 0.;
  }
  newSpike[1] =
      newSpike[0] / fdetector->FitS1(dx, dy, dz, VDetector::unfold) *
      fdetector->FitS1(
          0., 0., fdetector->get_TopDrift() - dS_mid * fdetector->get_dtCntr(),
          VDetector::unfold);

  return newSpike;  // regular and position-corrected spike counts returned
}